

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::ElementArrayBufferBindingTestCase::test
          (ElementArrayBufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  GLenum GVar2;
  allocator<char> local_f1;
  GLuint buffers [2];
  GLuint bufferObject;
  uint uStack_e4;
  string local_e0;
  string local_c0;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  code *local_38;
  GLenum local_30;
  
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"DefaultVAO",(allocator<char> *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Test with default VAO",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  _bufferObject = (ulong)uStack_e4 << 0x20;
  glu::CallLogWrapper::glGenBuffers(gl,1,&bufferObject);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Got Error ",(allocator<char> *)buffers);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_38);
    std::operator+(&local_78,&local_98,&local_58);
    std::operator+(&local_e0,&local_78,": ");
    std::operator+(&local_c0,&local_e0,"glGenBuffers");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
  }
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,bufferObject);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,bufferObject,(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers(gl,1,&bufferObject);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"WithVAO",(allocator<char> *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Test with VAO",(allocator<char> *)&local_98);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  _bufferObject = 0;
  buffers[0] = 0;
  buffers[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(gl,2,&bufferObject);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Got Error ",&local_f1);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_38);
    std::operator+(&local_78,&local_98,&local_58);
    std::operator+(&local_e0,&local_78,": ");
    std::operator+(&local_c0,&local_e0,"glGenVertexArrays");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
  }
  glu::CallLogWrapper::glGenBuffers(gl,2,buffers);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Got Error ",&local_f1);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_38);
    std::operator+(&local_78,&local_98,&local_58);
    std::operator+(&local_e0,&local_78,": ");
    std::operator+(&local_c0,&local_e0,"glGenBuffers");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
  }
  glu::CallLogWrapper::glBindVertexArray(gl,bufferObject);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,buffers[0]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,buffers[0],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindVertexArray(gl,uStack_e4);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindBuffer(gl,0x8893,buffers[1]);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,buffers[1],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glBindVertexArray(gl,bufferObject);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,buffers[0],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers(gl,2,buffers);
  deqp::gls::StateQueryUtil::verifyStateInteger(result,gl,0x8895,0,(this->super_BindingTest).m_type)
  ;
  glu::CallLogWrapper::glBindVertexArray(gl,uStack_e4);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8895,buffers[1],(this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteVertexArrays(gl,2,&bufferObject);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Got Error ",&local_f1);
    local_38 = glu::getErrorName;
    local_30 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_58,&local_38);
    std::operator+(&local_78,&local_98,&local_58);
    std::operator+(&local_e0,&local_78,": ");
    std::operator+(&local_c0,&local_e0,"glDeleteVertexArrays");
    tcu::ResultCollector::fail(result,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(gl.getLog(), "DefaultVAO", "Test with default VAO");

			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			GLuint bufferObject = 0;
			gl.glGenBuffers(1, &bufferObject);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, bufferObject);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, bufferObject, m_type);

			gl.glDeleteBuffers(1, &bufferObject);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(gl.getLog(), "WithVAO", "Test with VAO");

			GLuint vaos[2]		= {0};
			GLuint buffers[2]	= {0};

			gl.glGenVertexArrays(2, vaos);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenVertexArrays");

			gl.glGenBuffers(2, buffers);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

			// initial
			gl.glBindVertexArray(vaos[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// after setting
			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffers[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[0], m_type);

			// initial of vao 2
			gl.glBindVertexArray(vaos[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// after setting to 2
			gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buffers[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[1], m_type);

			// vao 1 still has buffer 1 bound?
			gl.glBindVertexArray(vaos[0]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[0], m_type);

			// deleting clears from bound vaos ...
			gl.glDeleteBuffers(2, buffers);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, 0, m_type);

			// ... but does not from non-bound vaos?
			gl.glBindVertexArray(vaos[1]);
			verifyStateInteger(result, gl, GL_ELEMENT_ARRAY_BUFFER_BINDING, buffers[1], m_type);

			gl.glDeleteVertexArrays(2, vaos);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteVertexArrays");
		}
	}